

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLapsp.c
# Opt level: O0

void RDL_findpaths(RDL_sPathInfo *spi,RDL_graph *gra)

{
  uint uVar1;
  uint uVar2;
  void *__ptr;
  uint *__ptr_00;
  uint *queue;
  char *color;
  uint local_38;
  uint q_size;
  uint q_nextfree;
  uint q_head;
  uint run;
  uint adj;
  uint w;
  uint j;
  uint i;
  uint INFINITY;
  RDL_graph *gra_local;
  RDL_sPathInfo *spi_local;
  
  __ptr = malloc((ulong)gra->V);
  __ptr_00 = (uint *)malloc((ulong)gra->V << 2);
  for (q_nextfree = 1; q_nextfree < 3; q_nextfree = q_nextfree + 1) {
    for (w = 0; w < gra->V; w = w + 1) {
      q_size = 0;
      for (adj = 0; adj < gra->V; adj = adj + 1) {
        if (q_nextfree == 1) {
          spi->dist[w][adj] = 0xffffffff;
          spi->pred[w][adj] = 0xffffffff;
          spi->reachable[w][adj] = '\0';
        }
        *(undefined1 *)((long)__ptr + (ulong)adj) = 0x77;
      }
      spi->dist[w][w] = 0;
      spi->pred[w][w] = w;
      *(undefined1 *)((long)__ptr + (ulong)w) = 0x62;
      *__ptr_00 = w;
      local_38 = 1;
      color._4_4_ = 1;
      while (color._4_4_ != 0) {
        uVar1 = __ptr_00[q_size];
        q_size = q_size + 1;
        color._4_4_ = color._4_4_ + -1;
        for (q_head = 0; q_head < gra->degree[uVar1]; q_head = q_head + 1) {
          uVar2 = gra->adjList[uVar1][q_head][0];
          if (((q_nextfree == 2) ||
              (((gra->degree[uVar2] == gra->degree[w] && (uVar2 < w)) ||
               (gra->degree[uVar2] < gra->degree[w])))) &&
             (*(char *)((long)__ptr + (ulong)uVar2) == 'w')) {
            if ((q_nextfree == 2) && (spi->dist[w][uVar1] + 1 < spi->dist[w][uVar2])) {
              spi->reachable[w][uVar2] = '\0';
            }
            if ((q_nextfree == 1) || (spi->dist[w][uVar1] + 1 < spi->dist[w][uVar2])) {
              spi->pred[w][uVar2] = uVar1;
            }
            if (spi->dist[w][uVar1] + 1 < spi->dist[w][uVar2]) {
              spi->dist[w][uVar2] = spi->dist[w][uVar1] + 1;
            }
            *(undefined1 *)((long)__ptr + (ulong)uVar2) = 0x62;
            __ptr_00[local_38] = uVar2;
            local_38 = local_38 + 1;
            color._4_4_ = color._4_4_ + 1;
            if (q_nextfree == 1) {
              spi->reachable[w][uVar2] = '\x01';
            }
          }
        }
      }
    }
  }
  free(__ptr);
  free(__ptr_00);
  return;
}

Assistant:

static void RDL_findpaths(RDL_sPathInfo *spi, RDL_graph *gra)
{
  const unsigned INFINITY = UINT_MAX;
  unsigned i,j,w,adj,run;
  unsigned q_head, q_nextfree, q_size;
  char *color = malloc(gra->V * sizeof(*color));
  unsigned *queue = malloc(gra->V * sizeof(*queue));

  for(run=1; run<3; ++run) /*2 run throughs to get Vr correct*/
  {
    for(i=0; i<gra->V; ++i)
    {
      /*initialization*/
      q_head=0;
      q_nextfree=0;
      q_size=0;
      for(j=0; j<gra->V; ++j)
      {
        if(run==1)
        {
          spi->dist[i][j] = INFINITY;
          spi->pred[i][j] = INFINITY;
          spi->reachable[i][j] = 0;
        }
        color[j] = 'w'; /*white*/
      }
      spi->dist[i][i] = 0;
      spi->pred[i][i] = i;
      color[i] = 'b'; /*black*/
      queue[q_nextfree]=i; /*enqueue*/
      ++q_nextfree; /*enqueue*/
      ++q_size; /*enqueue*/

      while(q_size > 0)
      {
        w = queue[q_head]; /*deqeue*/
        ++q_head; /*dequeue*/
        --q_size; /*dequeue*/
        for(adj=0; adj<gra->degree[w]; ++adj) /*for each node adj to w*/
        {
          j=gra->adjList[w][adj][0];
          /*if j precedes i in order (only first run)*/
          if(run==2 || ((gra->degree[j] == gra->degree[i]) && j<i) ||
          gra->degree[j] < gra->degree[i])
          if(color[j] == 'w') /*unvisited*/
          {
            if(run==2)
            {/*if in the 2nd run a dist gets shorter*/
              if(spi->dist[i][w]+1 < spi->dist[i][j])
              {/*not element of Vr*/
                spi->reachable[i][j] = 0;
              }
            }
            if(run==1 || (spi->dist[i][w]+1 < spi->dist[i][j]))
            {/*if 2nd run and dist stays the same, pred shouldn't
            change to keep the shortest path along ordering*/
              /*predecessor of j on a shortest path from i to j*/
              spi->pred[i][j] = w;
            }
            if(spi->dist[i][j] > spi->dist[i][w]+1)
            {
              spi->dist[i][j] = spi->dist[i][w] + 1;
            }
            color[j] = 'b';
            queue[q_nextfree] = j; /*enqueue*/
            ++q_nextfree; /*enqueue*/
            ++q_size; /*enqueue*/
            if(run==1)
            {/*reachable should not change to 1 in the 2nd run*/
              spi->reachable[i][j] = 1;
            }
          }
        }
      }
    }
  }

  free(color);
  free(queue);
}